

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Table * isSimpleCount(Select *p,AggInfo *pAggInfo)

{
  SrcList *pSVar1;
  Table *pTVar2;
  Expr *pEVar3;
  Table *pTVar4;
  int in_EDX;
  
  if ((((p->pWhere == (Expr *)0x0) && (p->pEList->nExpr == 1)) &&
      (pSVar1 = p->pSrc, pSVar1->nSrc == 1)) &&
     (((pSVar1->a[0].pSelect == (Select *)0x0 &&
       (pTVar2 = pSVar1->a[0].pTab, pTVar2->nModuleArg == 0)) &&
      ((pEVar3 = p->pEList->a[0].pExpr, in_EDX != 0 && pEVar3->op == 0x9f &&
       ((*(byte *)(*(long *)&pAggInfo->sortingIdxPTab + 5) & 1) != 0)))))) {
    pTVar4 = (Table *)0x0;
    if ((pEVar3->flags & 0x10) == 0) {
      pTVar4 = pTVar2;
    }
    return pTVar4;
  }
  return (Table *)0x0;
}

Assistant:

static Table *isSimpleCount(Select *p, AggInfo *pAggInfo){
  Table *pTab;
  Expr *pExpr;

  assert( !p->pGroupBy );

  if( p->pWhere || p->pEList->nExpr!=1 
   || p->pSrc->nSrc!=1 || p->pSrc->a[0].pSelect
  ){
    return 0;
  }
  pTab = p->pSrc->a[0].pTab;
  pExpr = p->pEList->a[0].pExpr;
  assert( pTab && !pTab->pSelect && pExpr );

  if( IsVirtual(pTab) ) return 0;
  if( pExpr->op!=TK_AGG_FUNCTION ) return 0;
  if( NEVER(pAggInfo->nFunc==0) ) return 0;
  if( (pAggInfo->aFunc[0].pFunc->funcFlags&SQLITE_FUNC_COUNT)==0 ) return 0;
  if( pExpr->flags&EP_Distinct ) return 0;

  return pTab;
}